

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O2

void Nwk_ManDeleteNode_rec(Nwk_Obj_t *pObj)

{
  Vec_Ptr_t *vNodes;
  void **ppvVar1;
  Nwk_Obj_t *pObj_00;
  int i;
  
  if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
    __assert_fail("!Nwk_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkObj.c"
                  ,0xbb,"void Nwk_ManDeleteNode_rec(Nwk_Obj_t *)");
  }
  if (pObj->nFanouts == 0) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar1 = (void **)malloc(800);
    vNodes->pArray = ppvVar1;
    Nwk_ObjCollectFanins(pObj,vNodes);
    Nwk_ManDeleteNode(pObj);
    for (i = 0; i < vNodes->nSize; i = i + 1) {
      pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(vNodes,i);
      if (((*(uint *)&pObj_00->field_0x20 & 7) == 3) && (pObj_00->nFanouts == 0)) {
        Nwk_ManDeleteNode_rec(pObj_00);
      }
    }
    free(vNodes->pArray);
    free(vNodes);
    return;
  }
  __assert_fail("Nwk_ObjFanoutNum(pObj) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkObj.c"
                ,0xbc,"void Nwk_ManDeleteNode_rec(Nwk_Obj_t *)");
}

Assistant:

void Nwk_ManDeleteNode_rec( Nwk_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Nwk_ObjIsCi(pObj) );
    assert( Nwk_ObjFanoutNum(pObj) == 0 );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ObjCollectFanins( pObj, vNodes );
    Nwk_ManDeleteNode( pObj );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
        if ( Nwk_ObjIsNode(pObj) && Nwk_ObjFanoutNum(pObj) == 0 )
            Nwk_ManDeleteNode_rec( pObj );
    Vec_PtrFree( vNodes );
}